

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

void __thiscall
pbrt::GoniometricLight::GoniometricLight
          (GoniometricLight *this,Transform *renderFromLight,MediumInterface *mediumInterface,
          Spectrum *Iemit,Float scale,Image *im,Allocator alloc)

{
  int iVar1;
  DenselySampledSpectrum *pDVar2;
  Tuple2<pbrt::Point2,_int> alloc_00;
  Tuple2<pbrt::Point2,_int> this_00;
  size_t sVar3;
  size_t sVar4;
  long in_RDI;
  char *fmt;
  char *file;
  char (*in_R8) [21];
  long *in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  Array2D<float> d;
  int vb_1;
  int va_1;
  int vb;
  int va;
  PiecewiseConstant2D *in_stack_fffffffffffffe68;
  PiecewiseConstant2D *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  Image *in_stack_fffffffffffffe80;
  Array2D<float> *in_stack_fffffffffffffe90;
  Image *in_stack_fffffffffffffe98;
  Allocator in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  char (*args_1) [21];
  LogLevel in_stack_fffffffffffffee4;
  Spectrum *in_stack_fffffffffffffef0;
  int *in_stack_fffffffffffffef8;
  char (*in_stack_ffffffffffffff00) [21];
  int *in_stack_ffffffffffffff08;
  int iStack_70;
  int local_68;
  char local_40 [20];
  undefined4 local_2c;
  
  local_2c = in_XMM0_Da;
  LightBase::LightBase
            ((LightBase *)in_stack_fffffffffffffe80,
             (LightType)((ulong)in_stack_fffffffffffffe78 >> 0x20),
             (Transform *)in_stack_fffffffffffffe70,(MediumInterface *)in_stack_fffffffffffffe68);
  args_1 = (char (*) [21])local_40;
  Spectrum::Spectrum((Spectrum *)in_stack_fffffffffffffe70,(Spectrum *)in_stack_fffffffffffffe68);
  pDVar2 = LightBase::LookupSpectrum(in_stack_fffffffffffffef0);
  *(DenselySampledSpectrum **)(in_RDI + 0x98) = pDVar2;
  *(undefined4 *)(in_RDI + 0xa0) = local_2c;
  fmt = (char *)(in_RDI + 0xa8);
  Image::Image((Image *)in_stack_fffffffffffffea0.memoryResource,in_stack_fffffffffffffe98);
  file = (char *)(in_RDI + 0x140);
  PiecewiseConstant2D::PiecewiseConstant2D
            ((PiecewiseConstant2D *)in_stack_fffffffffffffe98,in_stack_fffffffffffffea0);
  iVar1 = Image::NChannels((Image *)0x6b9bc0);
  if (iVar1 != 1) {
    LogFatal<char_const(&)[2],char_const(&)[18],char_const(&)[2],int&,char_const(&)[18],int&>
              (in_stack_fffffffffffffee4,file,(int)((ulong)in_RDI >> 0x20),fmt,(char (*) [2])in_R8,
               (char (*) [18])args_1,(char (*) [2])in_stack_fffffffffffffef0,
               in_stack_fffffffffffffef8,(char (*) [18])in_stack_ffffffffffffff00,
               in_stack_ffffffffffffff08);
  }
  alloc_00 = (Tuple2<pbrt::Point2,_int>)Image::Resolution((Image *)(in_RDI + 0xa8));
  local_68 = alloc_00.x;
  this_00 = (Tuple2<pbrt::Point2,_int>)Image::Resolution((Image *)(in_RDI + 0xa8));
  iStack_70 = this_00.y;
  if (local_68 != iStack_70) {
    LogFatal<char_const(&)[21],char_const(&)[21],char_const(&)[21],int&,char_const(&)[21],int&>
              (in_stack_fffffffffffffee4,file,(int)((ulong)in_RDI >> 0x20),fmt,in_R8,args_1,
               (char (*) [21])in_stack_fffffffffffffef0,in_stack_fffffffffffffef8,
               in_stack_ffffffffffffff00,in_stack_ffffffffffffff08);
  }
  Image::GetSamplingDistribution((Image *)CONCAT44(iVar1,in_stack_fffffffffffffea8));
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffe70);
  PiecewiseConstant2D::PiecewiseConstant2D
            ((PiecewiseConstant2D *)this_00,in_stack_fffffffffffffe90,(Allocator)alloc_00);
  PiecewiseConstant2D::operator=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  PiecewiseConstant2D::~PiecewiseConstant2D(in_stack_fffffffffffffe70);
  sVar3 = Image::BytesUsed(in_stack_fffffffffffffe80);
  sVar4 = PiecewiseConstant2D::BytesUsed((PiecewiseConstant2D *)in_stack_fffffffffffffe80);
  *(long *)(*in_FS_OFFSET + -0x2d0) = sVar3 + sVar4 + *(long *)(*in_FS_OFFSET + -0x2d0);
  Array2D<float>::~Array2D((Array2D<float> *)in_stack_fffffffffffffe80);
  return;
}

Assistant:

GoniometricLight::GoniometricLight(const Transform &renderFromLight,
                                   const MediumInterface &mediumInterface, Spectrum Iemit,
                                   Float scale, Image im, Allocator alloc)
    : LightBase(LightType::DeltaPosition, renderFromLight, mediumInterface),
      Iemit(LookupSpectrum(Iemit)),
      scale(scale),
      image(std::move(im)),
      distrib(alloc) {
    CHECK_EQ(1, image.NChannels());
    CHECK_EQ(image.Resolution().x, image.Resolution().y);
    // Compute sampling distribution for _GoniometricLight_
    Array2D<Float> d = image.GetSamplingDistribution();
    distrib = PiecewiseConstant2D(d);

    imageBytes += image.BytesUsed() + distrib.BytesUsed();
}